

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cpp
# Opt level: O2

string * (anonymous_namespace)::input_name_abi_cxx11_(void)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  bVar1 = anon_unknown.dwarf_966a::is_file_input();
  if (bVar1) {
    std::__cxx11::string::string((string *)in_RDI,(string *)(json_source_abi_cxx11_ + 0x88));
  }
  else {
    s_abi_cxx11_(in_RDI,"stdin",5);
  }
  return in_RDI;
}

Assistant:

std::string input_name () { return is_file_input () ? json_source.get () : "stdin"s; }